

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::ChLinkMotorLinearDriveline(ChLinkMotorLinearDriveline *this)

{
  double dVar1;
  __shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChLinkMotorLinear::ChLinkMotorLinear(&this->super_ChLinkMotorLinear);
  *(undefined ***)
   &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorLinearDriveline_0116bb08;
  (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.c_x = false;
  *(undefined8 *)&(this->super_ChLinkMotorLinear).field_0x278 = 0;
  *(undefined8 *)&this->field_0x280 = 0;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->shaft2_rotation_dir).m_data[0] = 0.0;
  (this->shaft2_rotation_dir).m_data[1] = 0.0;
  (this->shaft2_rotation_dir).m_data[2] = 0.0;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  std::make_shared<chrono::ChShaft>();
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorLinear).field_0x278,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaft>();
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaft>();
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaftsBodyTranslation>();
  std::__shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint1lin).
              super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaftsBodyTranslation>();
  std::__shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint2lin).
              super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaftsBody>();
  std::__shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint2rot).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  dVar1 = DAT_011dd3f8;
  if (this != (ChLinkMotorLinearDriveline *)(sBulletDNAstr64 + 0x3578)) {
    (this->shaft2_rotation_dir).m_data[0] = VECT_X;
    (this->shaft2_rotation_dir).m_data[1] = dVar1;
    (this->shaft2_rotation_dir).m_data[2] = DAT_011dd400;
  }
  return;
}

Assistant:

ChLinkMotorLinearDriveline::ChLinkMotorLinearDriveline() {
    
    this->c_x = false;
    SetupLinkMask();

    innershaft1lin = chrono_types::make_shared<ChShaft>();
    innershaft2lin = chrono_types::make_shared<ChShaft>();
    innershaft2rot = chrono_types::make_shared<ChShaft>();
    innerconstraint1lin = chrono_types::make_shared<ChShaftsBodyTranslation>();
    innerconstraint2lin = chrono_types::make_shared<ChShaftsBodyTranslation>(); 
    innerconstraint2rot = chrono_types::make_shared<ChShaftsBody>(); 
    shaft2_rotation_dir = VECT_X;
}